

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  ImVec2 IVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  GetterXsYs<double> *pGVar7;
  TransformerLinLog *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  uint uVar14;
  long lVar15;
  float fVar16;
  double dVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  
  pIVar12 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar4 = pGVar7->Count;
  lVar15 = (long)(((pGVar7->Offset + prim + 1) % iVar4 + iVar4) % iVar4) * (long)pGVar7->Stride;
  dVar1 = *(double *)((long)pGVar7->Xs + lVar15);
  dVar17 = log10(*(double *)((long)pGVar7->Ys + lVar15) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  pIVar13 = GImPlot;
  iVar4 = pTVar8->YAxis;
  pIVar9 = pIVar12->CurrentPlot;
  dVar2 = pIVar9->YAxis[iVar4].Range.Min;
  pGVar7 = this->Getter2;
  pTVar8 = this->Transformer;
  iVar5 = pGVar7->Count;
  lVar15 = (long)(((prim + 1 + pGVar7->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar7->Stride;
  IVar3 = pIVar12->PixelRange[iVar4].Min;
  fVar19 = (float)(pIVar12->Mx * (dVar1 - (pIVar9->XAxis).Range.Min) + (double)IVar3.x);
  fVar23 = (float)(pIVar12->My[iVar4] *
                   (((double)(float)(dVar17 / pIVar12->LogDenY[iVar4]) *
                     (pIVar9->YAxis[iVar4].Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar3.y);
  dVar1 = *(double *)((long)pGVar7->Xs + lVar15);
  dVar17 = log10(*(double *)((long)pGVar7->Ys + lVar15) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar4 = pTVar8->YAxis;
  pIVar9 = pIVar13->CurrentPlot;
  dVar2 = pIVar9->YAxis[iVar4].Range.Min;
  IVar3 = pIVar13->PixelRange[iVar4].Min;
  fVar16 = (float)(pIVar13->Mx * (dVar1 - (pIVar9->XAxis).Range.Min) + (double)IVar3.x);
  fVar18 = (float)(pIVar13->My[iVar4] *
                   (((double)(float)(dVar17 / pIVar13->LogDenY[iVar4]) *
                     (pIVar9->YAxis[iVar4].Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar3.y);
  fVar24 = (this->P12).x;
  fVar25 = (this->P12).y;
  fVar27 = (this->P11).x;
  fVar28 = (this->P11).y;
  fVar20 = fVar23 * fVar27 - fVar19 * fVar28;
  fVar29 = fVar24 * fVar18 - fVar25 * fVar16;
  fVar27 = fVar27 - fVar19;
  fVar24 = fVar24 - fVar16;
  fVar26 = fVar25 - fVar18;
  fVar30 = fVar26 * fVar27 - (fVar28 - fVar23) * fVar24;
  auVar21._0_4_ = fVar20 * fVar24 - fVar29 * fVar27;
  auVar21._4_4_ = fVar20 * fVar26 - fVar29 * (fVar28 - fVar23);
  auVar21._8_4_ = fVar23 * 0.0 - fVar25 * 0.0;
  auVar21._12_4_ = fVar23 * 0.0 - fVar25 * 0.0;
  auVar22._4_4_ = fVar30;
  auVar22._0_4_ = fVar30;
  auVar22._8_4_ = fVar26;
  auVar22._12_4_ = fVar26;
  auVar22 = divps(auVar21,auVar22);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10->col = this->Col;
  pIVar10[1].pos.x = fVar19;
  pIVar10[1].pos.y = fVar23;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[1].col = this->Col;
  pIVar10[2].pos = auVar22._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[2].col = this->Col;
  pIVar10[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[3].col = this->Col;
  pIVar10[4].uv.x = fVar16;
  pIVar10[4].uv.y = fVar18;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar10 + 5;
  uVar6 = DrawList->_VtxCurrentIdx;
  puVar11 = DrawList->_IdxWritePtr;
  *puVar11 = uVar6;
  uVar14 = -(uint)(fVar23 < fVar18 && fVar25 < fVar28 || fVar18 < fVar23 && fVar28 < fVar25) & 1;
  puVar11[1] = uVar6 + uVar14 + 1;
  puVar11[2] = DrawList->_VtxCurrentIdx + 3;
  puVar11[3] = DrawList->_VtxCurrentIdx + 1;
  puVar11[4] = (uVar14 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar11[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar11 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar19;
  (this->P11).y = fVar23;
  (this->P12).x = fVar16;
  (this->P12).y = fVar18;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }